

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorList::retrieveNode(MemoryLeakDetectorList *this,char *memory)

{
  MemoryLeakDetectorNode *pMVar1;
  
  pMVar1 = this->head_;
  while( true ) {
    if (pMVar1 == (MemoryLeakDetectorNode *)0x0) {
      return (MemoryLeakDetectorNode *)0x0;
    }
    if (*(char **)(pMVar1 + 0x10) == memory) break;
    pMVar1 = *(MemoryLeakDetectorNode **)(pMVar1 + 0x38);
  }
  return pMVar1;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorList::retrieveNode(char* memory)
{
  MemoryLeakDetectorNode* cur = head_;
  while (cur) {
    if (cur->memory_ == memory)
      return cur;
    cur = cur->next_;
  }
  return NULLPTR;
}